

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

int __thiscall doctest::Context::run(Context *this)

{
  String *this_00;
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  pointer pvVar5;
  const_iterator __position;
  pointer ppIVar6;
  TestCase *pTVar7;
  anon_unknown_15 *paVar8;
  TestRunStats *pTVar9;
  ContextState *pCVar10;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  __last;
  bool bVar11;
  char cVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  int result;
  int iVar20;
  undefined1 *puVar21;
  char *pcVar22;
  _Base_ptr p_Var23;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Var24;
  size_t sVar25;
  const_iterator cVar26;
  long lVar27;
  pointer pSVar28;
  ContextState *pCVar29;
  size_type sVar30;
  uint uVar31;
  pointer pSVar32;
  code *__comp;
  IReporter **curr;
  TestCase *this_01;
  pointer ppIVar33;
  _Base_ptr this_02;
  _Ios_Openmode _Var34;
  IReporter **curr_rep;
  ulong uVar35;
  long in_FS_OFFSET;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  timeval t;
  stack_t sigStack;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  fstream fstr;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  local_398;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Stack_390;
  long local_388;
  void *local_378;
  long lStack_370;
  long local_368;
  TestCase *local_358;
  TestCase **local_350;
  ContextState *local_348;
  TestCase **local_340;
  anon_union_24_2_13149d16_for_String_3 local_338 [5];
  int local_2b0;
  anon_unknown_15 *local_298;
  ContextState *local_290;
  sigaltstack local_288;
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  local_270;
  char local_240 [16];
  ostream local_230;
  
  pCVar10 = detail::g_cs;
  pCVar29 = this->p;
  is_running_in_test = 1;
  detail::g_cs = pCVar29;
  *(bool *)(in_FS_OFFSET + -0x38) = (pCVar29->super_ContextOptions).no_colors;
  (pCVar29->super_TestRunStats).numAsserts = 0;
  (pCVar29->super_TestRunStats).numAssertsFailed = 0;
  (pCVar29->super_CurrentTestCaseStats).numAssertsCurrentTest = 0;
  (pCVar29->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = 0;
  (pCVar29->super_TestRunStats).numTestCases = 0;
  (pCVar29->super_TestRunStats).numTestCasesPassingFilters = 0;
  (pCVar29->super_TestRunStats).numTestSuitesPassingFilters = 0;
  (pCVar29->super_TestRunStats).numTestCasesFailed = 0;
  std::fstream::fstream(local_240);
  pCVar29 = this->p;
  if ((pCVar29->super_ContextOptions).cout == (ostream *)0x0) {
    if ((pCVar29->super_ContextOptions).quiet == true) {
      puVar21 = discardOut;
    }
    else {
      bVar13 = (pCVar29->super_ContextOptions).out.field_0.buf[0x17];
      if ((char)bVar13 < '\0') {
        sVar30 = (pCVar29->super_ContextOptions).out.field_0.data.size;
      }
      else {
        sVar30 = 0x17 - (bVar13 & 0x1f);
      }
      if (sVar30 == 0) {
        puVar21 = (undefined1 *)&std::cout;
      }
      else {
        if ((char)bVar13 < '\0') {
          _Var34 = (_Ios_Openmode)*(undefined8 *)&(pCVar29->super_ContextOptions).out.field_0;
        }
        else {
          _Var34 = (int)pCVar29 + (_S_trunc|_S_in);
        }
        std::fstream::open(local_240,_Var34);
        puVar21 = (undefined1 *)&local_230;
        pCVar29 = this->p;
      }
    }
    (pCVar29->super_ContextOptions).cout = (ostream *)puVar21;
  }
  (anonymous_namespace)::FatalConditionHandler::altStackMem =
       operator_new__((anonymous_namespace)::FatalConditionHandler::altStackSize);
  pvVar5 = (pCVar29->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar5[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_start ==
      pvVar5[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar22 = String::allocate((String *)local_338,7);
    builtin_strncpy(pcVar22,"console",7);
    std::vector<doctest::String,_std::allocator<doctest::String>_>::emplace_back<doctest::String>
              (pvVar5 + 8,(String *)local_338);
    if (((long)local_338[0]._16_8_ < 0) && ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
      operator_delete__((void *)local_338[0]._0_8_);
    }
  }
  local_348 = pCVar10;
  anon_unknown_15::getReporters();
  if ((_Rb_tree_header *)
      anon_unknown_15::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_15::getReporters::data._M_t._M_impl.super__Rb_tree_header) {
    p_Var23 = anon_unknown_15::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      if (*(char *)((long)&p_Var23[1]._M_right + 7) < '\0') {
        this_02 = p_Var23[1]._M_parent;
      }
      else {
        this_02 = (_Base_ptr)&p_Var23[1]._M_parent;
      }
      pCVar29 = this->p;
      pvVar5 = (pCVar29->filters).
               super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar11 = anon_unknown_15::matchesAny
                         ((anon_unknown_15 *)this_02,
                          *(char **)&pvVar5[8].
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[8].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,
                          (pCVar29->super_ContextOptions).case_sensitive);
      if (bVar11) {
        local_338[0]._0_8_ = (**(code **)(p_Var23 + 2))(detail::g_cs);
        std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>::
        emplace_back<doctest::IReporter*>
                  ((vector<doctest::IReporter*,std::allocator<doctest::IReporter*>> *)
                   &pCVar29->reporters_currently_used,(IReporter **)local_338);
      }
      p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
    } while ((_Rb_tree_header *)p_Var23 !=
             &anon_unknown_15::getReporters::data._M_t._M_impl.super__Rb_tree_header);
  }
  anon_unknown_15::getListeners();
  if ((_Rb_tree_header *)
      anon_unknown_15::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_15::getListeners::data._M_t._M_impl.super__Rb_tree_header) {
    p_Var23 = anon_unknown_15::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      pCVar29 = this->p;
      __position._M_current =
           (pCVar29->reporters_currently_used).
           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_338[0]._0_8_ = (**(code **)(p_Var23 + 2))(detail::g_cs);
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::_M_insert_rval
                (&pCVar29->reporters_currently_used,__position,(value_type *)local_338);
      p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
    } while ((_Rb_tree_header *)p_Var23 !=
             &anon_unknown_15::getListeners::data._M_t._M_impl.super__Rb_tree_header);
  }
  pCVar29 = this->p;
  if (((((pCVar29->super_ContextOptions).no_run != false) ||
       ((pCVar29->super_ContextOptions).version != false)) ||
      ((pCVar29->super_ContextOptions).help != false)) ||
     ((pCVar29->super_ContextOptions).list_reporters == true)) {
    ppIVar33 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar33 != ppIVar6) {
      do {
        local_338[0].data.ptr = (TestCase *)0x0;
        local_338[0]._8_8_ = (void *)0x0;
        local_338[0]._16_8_ = 0;
        (**(*ppIVar33)->_vptr_IReporter)(*ppIVar33,local_338);
        ppIVar33 = ppIVar33 + 1;
      } while (ppIVar33 != ppIVar6);
    }
    if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
      operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
    }
    cVar12 = std::__basic_file<char>::is_open();
    pCVar29 = local_348;
    if (cVar12 != '\0') {
      std::fstream::close();
    }
    detail::g_cs = pCVar29;
    is_running_in_test = 0;
    pCVar29 = this->p;
    ppIVar33 = (pCVar29->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar6 = (pCVar29->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar33 != ppIVar6) {
      do {
        if (*ppIVar33 != (IReporter *)0x0) {
          (*(*ppIVar33)->_vptr_IReporter[0xd])();
        }
        ppIVar33 = ppIVar33 + 1;
      } while (ppIVar33 != ppIVar6);
      pCVar29 = this->p;
      ppIVar33 = (pCVar29->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if ((pCVar29->reporters_currently_used).
          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppIVar33) {
        (pCVar29->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppIVar33;
      }
    }
    if (((pCVar29->super_TestRunStats).numTestCasesFailed == 0) ||
       (iVar20 = 1, (pCVar29->super_ContextOptions).no_exitcode == true)) {
      iVar20 = 0;
    }
    goto LAB_0010ad57;
  }
  local_398._M_current = (TestCase **)0x0;
  _Stack_390._M_current = (TestCase **)0x0;
  local_388 = 0;
  detail::getRegisteredTests();
  if ((_Rb_tree_header *)
      detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    p_Var23 = detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_338[0]._0_8_ = p_Var23 + 1;
      std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
      ::emplace_back<doctest::detail::TestCase_const*>
                ((vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
                  *)&local_398,(TestCase **)local_338);
      p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
    } while ((_Rb_tree_header *)p_Var23 !=
             &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header);
  }
  __last._M_current = _Stack_390._M_current;
  _Var24._M_current = local_398._M_current;
  pCVar29 = this->p;
  (pCVar29->super_TestRunStats).numTestCases =
       (uint)((ulong)((long)_Stack_390._M_current - (long)local_398._M_current) >> 3);
  if (_Stack_390._M_current != local_398._M_current) {
    this_00 = &(pCVar29->super_ContextOptions).order_by;
    iVar20 = String::compare(this_00,"file",true);
    if (iVar20 == 0) {
      __comp = anon_unknown_15::fileOrderComparator;
    }
    else {
      iVar20 = String::compare(this_00,"suite",true);
      if (iVar20 == 0) {
        __comp = anon_unknown_15::suiteOrderComparator;
      }
      else {
        iVar20 = String::compare(this_00,"name",true);
        if (iVar20 != 0) {
          iVar20 = String::compare(this_00,"rand",true);
          if (iVar20 == 0) {
            srand((pCVar29->super_ContextOptions).rand_seed);
            _Var24._M_current = local_398._M_current;
            for (uVar35 = (long)_Stack_390._M_current - (long)local_398._M_current >> 3; uVar35 != 1
                ; uVar35 = uVar35 - 1) {
              iVar20 = rand();
              pTVar7 = _Var24._M_current[uVar35 - 1];
              iVar20 = (int)((ulong)(long)iVar20 % uVar35);
              _Var24._M_current[uVar35 - 1] = _Var24._M_current[iVar20];
              _Var24._M_current[iVar20] = pTVar7;
            }
          }
          goto LAB_0010aecd;
        }
        __comp = anon_unknown_15::nameOrderComparator;
      }
    }
    std::
    sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
              (_Var24,__last,__comp);
  }
LAB_0010aecd:
  local_270._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_270._M_impl.super__Rb_tree_header._M_header;
  local_270._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_270._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_270._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar29 = this->p;
  local_270._M_impl.super__Rb_tree_header._M_header._M_right =
       local_270._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((pCVar29->super_ContextOptions).count == false) &&
     ((pCVar29->super_ContextOptions).list_test_cases != true)) {
    local_378 = (void *)0x0;
    lStack_370 = 0;
    local_368 = 0;
    bVar11 = true;
    if ((pCVar29->super_ContextOptions).list_test_suites == false) {
      ppIVar6 = (detail::g_cs->reporters_currently_used).
                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar33 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar33 != ppIVar6;
          ppIVar33 = ppIVar33 + 1) {
        (*(*ppIVar33)->_vptr_IReporter[1])();
      }
      bVar11 = false;
    }
  }
  else {
    local_378 = (void *)0x0;
    lStack_370 = 0;
    local_368 = 0;
    bVar11 = true;
  }
  local_350 = _Stack_390._M_current;
  _Var24._M_current = local_398._M_current;
  if (local_398._M_current != _Stack_390._M_current) {
    do {
      pTVar7 = *_Var24._M_current;
      local_290 = this->p;
      if ((pTVar7->super_TestCaseData).m_skip == true) {
        bVar13 = (local_290->super_ContextOptions).no_skip ^ 1;
      }
      else {
        bVar13 = 0;
      }
      this_01 = pTVar7;
      if ((pTVar7->super_TestCaseData).m_file.field_0.buf[0x17] < '\0') {
        this_01 = (TestCase *)(pTVar7->super_TestCaseData).m_file.field_0.data.ptr;
      }
      pvVar5 = (local_290->filters).
               super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar19 = (local_290->super_ContextOptions).case_sensitive;
      local_340 = _Var24._M_current;
      bVar14 = anon_unknown_15::matchesAny
                         ((anon_unknown_15 *)this_01,
                          *(char **)&(pvVar5->
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     )._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          (pvVar5->
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar19);
      bVar15 = anon_unknown_15::matchesAny
                         ((anon_unknown_15 *)this_01,
                          *(char **)&pvVar5[1].
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[1].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar19);
      paVar8 = (anon_unknown_15 *)(pTVar7->super_TestCaseData).m_test_suite;
      bVar16 = anon_unknown_15::matchesAny
                         (paVar8,*(char **)&pvVar5[2].
                                            super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                            ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[2].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar19);
      local_298 = paVar8;
      bVar17 = anon_unknown_15::matchesAny
                         (paVar8,*(char **)&pvVar5[3].
                                            super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                            ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[3].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar19);
      paVar8 = (anon_unknown_15 *)(pTVar7->super_TestCaseData).m_name;
      local_358 = pTVar7;
      bVar18 = anon_unknown_15::matchesAny
                         (paVar8,*(char **)&pvVar5[4].
                                            super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                            ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[4].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar19);
      bVar19 = anon_unknown_15::matchesAny
                         (paVar8,*(char **)&pvVar5[5].
                                            super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                            ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[5].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar19);
      paVar8 = local_298;
      pTVar7 = local_358;
      uVar31 = (local_290->super_TestRunStats).numTestCasesPassingFilters;
      if ((!bVar19 && (bVar13 & 1) == 0) && ((bVar18 && (!bVar17 && !bVar15)) && (bVar16 && bVar14))
         ) {
        uVar31 = uVar31 + 1;
        (local_290->super_TestRunStats).numTestCasesPassingFilters = uVar31;
      }
      uVar3 = (local_290->super_ContextOptions).first;
      uVar4 = (local_290->super_ContextOptions).last;
      if ((uVar3 <= uVar31 && (uVar4 < uVar3 || uVar31 <= uVar4)) &&
          ((!bVar19 && (bVar13 & 1) == 0) &&
          ((bVar18 && (!bVar17 && !bVar15)) && (bVar16 && bVar14)))) {
        if ((local_290->super_ContextOptions).count == false) {
          if ((local_290->super_ContextOptions).list_test_cases == true) {
            local_338[0].data.ptr = local_358;
            std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>::
            emplace_back<doctest::TestCaseData_const*>
                      ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                        *)&local_378,(TestCaseData **)local_338);
          }
          else if ((local_290->super_ContextOptions).list_test_suites == true) {
            sVar25 = strlen((char *)local_298);
            pcVar22 = String::allocate((String *)local_338,(size_type)sVar25);
            memcpy(pcVar22,paVar8,sVar25 & 0xffffffff);
            cVar26 = std::
                     _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                     ::find(&local_270,(key_type *)local_338);
            if ((_Rb_tree_header *)cVar26._M_node == &local_270._M_impl.super__Rb_tree_header) {
              cVar12 = *(pTVar7->super_TestCaseData).m_test_suite;
              if (((long)local_338[0]._16_8_ < 0) &&
                 ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
                operator_delete__((void *)local_338[0]._0_8_);
              }
              if (cVar12 != '\0') {
                local_338[0].data.ptr = pTVar7;
                std::
                vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>::
                emplace_back<doctest::TestCaseData_const*>
                          ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                            *)&local_378,(TestCaseData **)local_338);
                String::String((String *)local_338,(pTVar7->super_TestCaseData).m_test_suite);
                std::
                _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                ::_M_insert_unique<doctest::String>(&local_270,(String *)local_338);
                if (((long)local_338[0]._16_8_ < 0) &&
                   ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
                  operator_delete__((void *)local_338[0]._0_8_);
                }
                puVar2 = &(this->p->super_TestRunStats).numTestSuitesPassingFilters;
                *puVar2 = *puVar2 + 1;
              }
            }
            else if (((long)local_338[0]._16_8_ < 0) &&
                    ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
              operator_delete__((void *)local_338[0]._0_8_);
            }
          }
          else {
            (local_290->super_ContextOptions).currentTest = local_358;
            (local_290->super_CurrentTestCaseStats).failure_flags = 0;
            (local_290->super_CurrentTestCaseStats).seconds = 0.0;
            lVar27 = 0;
            do {
              LOCK();
              pcVar22 = (local_290->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                        lVar27 + -4;
              pcVar22[0] = '\0';
              pcVar22[1] = '\0';
              pcVar22[2] = '\0';
              pcVar22[3] = '\0';
              UNLOCK();
              lVar27 = lVar27 + 0x40;
            } while (lVar27 != 0x800);
            pCVar29 = this->p;
            lVar27 = 0;
            do {
              LOCK();
              pcVar22 = (pCVar29->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar27 + -4;
              pcVar22[0] = '\0';
              pcVar22[1] = '\0';
              pcVar22[2] = '\0';
              pcVar22[3] = '\0';
              UNLOCK();
              lVar27 = lVar27 + 0x40;
            } while (lVar27 != 0x800);
            std::
            _Hashtable<unsigned_long_long,_unsigned_long_long,_std::allocator<unsigned_long_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&(this->p->fullyTraversedSubcases)._M_h);
            ppIVar6 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar33 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar33 != ppIVar6;
                ppIVar33 = ppIVar33 + 1) {
              (*(*ppIVar33)->_vptr_IReporter[3])();
            }
            pCVar29 = this->p;
            gettimeofday((timeval *)local_338,(__timezone_ptr_t)0x0);
            (pCVar29->timer).m_ticks =
                 (ticks_t)(local_338[0].data.ptr * 1000000 + local_338[0]._8_8_);
            pCVar29 = this->p;
            bVar19 = true;
            do {
              pCVar29->reachedLeaf = false;
              std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
              _M_erase_at_end(&pCVar29->subcaseStack,
                              (pCVar29->subcaseStack).
                              super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              pCVar29 = this->p;
              pCVar29->currentSubcaseDepth = 0;
              LOCK();
              (pCVar29->shouldLogCurrentException)._M_base._M_i = true;
              UNLOCK();
              std::vector<doctest::String,_std::allocator<doctest::String>_>::_M_erase_at_end
                        (&this->p->stringifiedContexts,
                         (this->p->stringifiedContexts).
                         super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              (anonymous_namespace)::FatalConditionHandler::isSet = 1;
              local_288.ss_sp = (anonymous_namespace)::FatalConditionHandler::altStackMem;
              local_288.ss_size = (anonymous_namespace)::FatalConditionHandler::altStackSize;
              local_288.ss_flags = 0;
              sigaltstack(&local_288,
                          (sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack);
              memset((void *)((long)local_338 + 8),0,0x90);
              local_338[0].data.ptr = anon_unknown_15::FatalConditionHandler::handleSignal;
              local_2b0 = 0x8000000;
              puVar21 = (anonymous_namespace)::FatalConditionHandler::oldSigActions;
              lVar27 = 0;
              do {
                sigaction(*(int *)((long)&(anonymous_namespace)::signalDefs + lVar27),
                          (sigaction *)local_338,(sigaction *)puVar21);
                lVar27 = lVar27 + 0x10;
                puVar21 = (undefined1 *)((long)puVar21 + 0x98);
              } while (lVar27 != 0x60);
              (*pTVar7->m_test)();
              anon_unknown_15::FatalConditionHandler::reset();
              anon_unknown_15::FatalConditionHandler::reset();
              pCVar29 = this->p;
              if (0 < (pCVar29->super_ContextOptions).abort_after) {
                pTVar9 = &pCVar29->super_TestRunStats;
                iVar20 = 0;
                lVar27 = 0;
                do {
                  iVar20 = iVar20 + *(int *)((pCVar29->numAssertsFailedCurrentTest_atomic).m_atomics
                                             [0].padding + lVar27 + -4);
                  lVar27 = lVar27 + 0x40;
                } while (lVar27 != 0x800);
                pCVar29 = this->p;
                if ((pCVar29->super_ContextOptions).abort_after <= iVar20 + pTVar9->numAssertsFailed
                   ) {
                  piVar1 = &(pCVar29->super_CurrentTestCaseStats).failure_flags;
                  *(byte *)piVar1 = (byte)*piVar1 | 8;
                  bVar19 = false;
                }
              }
              pSVar28 = (pCVar29->nextSubcaseStack).
                        super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pSVar32 = (pCVar29->nextSubcaseStack).
                        super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (pSVar28 == pSVar32) break;
              if (bVar19) {
                ppIVar33 = (detail::g_cs->reporters_currently_used).
                           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppIVar6 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if (ppIVar33 != ppIVar6) {
                  do {
                    (*(*ppIVar33)->_vptr_IReporter[4])(*ppIVar33,pTVar7);
                    ppIVar33 = ppIVar33 + 1;
                  } while (ppIVar33 != ppIVar6);
                  pCVar29 = this->p;
                  pSVar28 = (pCVar29->nextSubcaseStack).
                            super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pSVar32 = (pCVar29->nextSubcaseStack).
                            super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
              }
              if (pSVar28 == pSVar32) {
                bVar19 = false;
              }
            } while (bVar19);
            detail::ContextState::finalizeTestCaseData(pCVar29);
            ppIVar6 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar33 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar33 != ppIVar6;
                ppIVar33 = ppIVar33 + 1) {
              (*(*ppIVar33)->_vptr_IReporter[5])
                        (*ppIVar33,&detail::g_cs->super_CurrentTestCaseStats);
            }
            pCVar29 = this->p;
            (pCVar29->super_ContextOptions).currentTest = (TestCase *)0x0;
            iVar20 = (pCVar29->super_ContextOptions).abort_after;
            if ((0 < iVar20) && (iVar20 <= (pCVar29->super_TestRunStats).numAssertsFailed)) break;
          }
        }
      }
      else if (!bVar11) {
        ppIVar6 = (detail::g_cs->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppIVar33 = (detail::g_cs->reporters_currently_used).
                        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppIVar33 != ppIVar6;
            ppIVar33 = ppIVar33 + 1) {
          (*(*ppIVar33)->_vptr_IReporter[0xb])(*ppIVar33,pTVar7);
        }
      }
      _Var24._M_current = local_340 + 1;
    } while (local_340 + 1 != local_350);
  }
  if (bVar11) {
    local_338[0]._0_8_ = &detail::g_cs->super_TestRunStats;
    if (detail::g_cs == (ContextState *)0x0) {
      local_338[0]._0_8_ = (TestCase *)0x0;
    }
    local_338[0]._8_8_ = local_378;
    local_338[0]._16_4_ = (int)((ulong)(lStack_370 - (long)local_378) >> 3);
    ppIVar33 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar33 != ppIVar6) {
      do {
        (**(*ppIVar33)->_vptr_IReporter)(*ppIVar33,local_338);
        ppIVar33 = ppIVar33 + 1;
      } while (ppIVar33 != ppIVar6);
    }
  }
  else {
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar33 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar33 != ppIVar6;
        ppIVar33 = ppIVar33 + 1) {
      (*(*ppIVar33)->_vptr_IReporter[2])(*ppIVar33,&detail::g_cs->super_TestRunStats);
    }
  }
  if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
    operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
  }
  cVar12 = std::__basic_file<char>::is_open();
  pCVar29 = local_348;
  if (cVar12 != '\0') {
    std::fstream::close();
  }
  detail::g_cs = pCVar29;
  is_running_in_test = 0;
  pCVar29 = this->p;
  ppIVar33 = (pCVar29->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppIVar6 = (pCVar29->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar33 != ppIVar6) {
    do {
      if (*ppIVar33 != (IReporter *)0x0) {
        (*(*ppIVar33)->_vptr_IReporter[0xd])();
      }
      ppIVar33 = ppIVar33 + 1;
    } while (ppIVar33 != ppIVar6);
    pCVar29 = this->p;
    ppIVar33 = (pCVar29->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pCVar29->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar33) {
      (pCVar29->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar33;
    }
  }
  if (((pCVar29->super_TestRunStats).numTestCasesFailed == 0) ||
     (iVar20 = 1, (pCVar29->super_ContextOptions).no_exitcode == true)) {
    iVar20 = 0;
  }
  if (local_378 != (void *)0x0) {
    operator_delete(local_378,local_368 - (long)local_378);
  }
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree(&local_270);
  if (local_398._M_current != (TestCase **)0x0) {
    operator_delete(local_398._M_current,local_388 - (long)local_398._M_current);
  }
LAB_0010ad57:
  std::fstream::~fstream(local_240);
  return iVar20;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    std::fstream fstr;
    if(p->cout == nullptr) {
        if(p->quiet) {
            p->cout = &discardOut;
        } else if(p->out.size()) {
            // to a file if specified
            fstr.open(p->out.c_str(), std::fstream::out);
            p->cout = &fstr;
        } else {
            // stdout by default
            p->cout = &std::cout;
        }
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1);

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->fullyTraversedSubcases.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();
            
            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->reachedLeaf = false;
                // May not be empty if previous subcase exited via exception.
                p->subcaseStack.clear();
                p->currentSubcaseDepth = 0;

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }
                
                if(!p->nextSubcaseStack.empty() && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(p->nextSubcaseStack.empty())
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    return cleanup_and_return();
}